

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O2

CVmTimeZone * __thiscall
CVmTimeZoneCache::parse_zone_2(CVmTimeZoneCache *this,char *name,size_t len)

{
  int iVar1;
  CVmTimeZone *pCVar2;
  
  iVar1 = lib_stricmp(name,len,"z");
  if (iVar1 != 0) {
    iVar1 = lib_stricmp(name,len,"utc");
    if (iVar1 != 0) {
      iVar1 = lib_stricmp(name,len,"gmt");
      if (iVar1 != 0) {
        pCVar2 = parse_zone_hhmmss(this,"",name,len);
        if (pCVar2 == (CVmTimeZone *)0x0) {
          pCVar2 = parse_zone_hhmmss(this,"utc",name,len);
          if (pCVar2 == (CVmTimeZone *)0x0) {
            pCVar2 = parse_zone_posixTZ(this,name,len);
            if (pCVar2 == (CVmTimeZone *)0x0) {
              pCVar2 = get_db_zone(G_tzcache_X,name,len);
              return pCVar2;
            }
          }
        }
        return pCVar2;
      }
    }
  }
  pCVar2 = get_gmtofs_zone(this,0);
  return pCVar2;
}

Assistant:

CVmTimeZone *CVmTimeZoneCache::parse_zone_2(VMG_ const char *name, size_t len)
{
    /* check for special zones: "Z", "UTC", "GMT" all mean UTC+0 */
    if (lib_stricmp(name, len, "z") == 0
        || lib_stricmp(name, len, "utc") == 0
        || lib_stricmp(name, len, "gmt") == 0)
        return get_gmtofs_zone(vmg_ 0);

    /* try +8, -830, +8:30, -8:00:00 */
    CVmTimeZone *tz;
    if ((tz = parse_zone_hhmmss(vmg_ "", name, len)) != 0)
        return tz;
    
    /* try UTC+8, UTC-830, UTC+8:30, UTC-8:00:00 */
    if ((tz = parse_zone_hhmmss(vmg_ "utc", name, len)) != 0)
        return tz;

    /* try parsing as a POSIX-style EST5EDT string */
    if ((tz = parse_zone_posixTZ(vmg_ name, len)) != 0)
        return tz;
    
    /* it's not one of our special formats; look it up in the database */
    if ((tz = G_tzcache->get_db_zone(vmg_ name, len)) != 0)
        return tz;

    /* return failure */
    return 0;
}